

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O0

BoolInt CPU_IsSupported_SHA512(void)

{
  BoolInt BVar1;
  UInt32 UVar2;
  uint local_28 [2];
  UInt32 d [4];
  uint local_c;
  
  BVar1 = CPU_IsSupported_AVX2();
  if (BVar1 == 0) {
    local_c = 0;
  }
  else {
    UVar2 = z7_x86_cpuid_GetMaxFunc();
    if (UVar2 < 7) {
      local_c = 0;
    }
    else {
      z7_x86_cpuid_subFunc(local_28,7,0);
      if (local_28[0] == 0) {
        local_c = 0;
      }
      else {
        z7_x86_cpuid_subFunc(local_28,7,1);
        local_c = local_28[0] & 1;
      }
    }
  }
  return local_c;
}

Assistant:

BoolInt CPU_IsSupported_SHA512(void)
{
  if (!CPU_IsSupported_AVX2()) return False; // maybe CPU_IsSupported_AVX() is enough here

  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid_subFunc(d, 7, 0);
    if (d[0] < 1) // d[0] - is max supported subleaf value
      return False;
    z7_x86_cpuid_subFunc(d, 7, 1);
    return (BoolInt)(d[0]) & 1;
  }
}